

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_00;
  locale_ref local_2c8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_2c0;
  buffer_appender<char> local_2b0;
  undefined1 local_2a8 [8];
  format_context format_ctx;
  basic_string_view<char> local_280;
  undefined1 local_270 [8];
  format_parse_context parse_ctx;
  allocator<char> local_241;
  undefined1 local_240 [8];
  memory_buffer buf;
  stringifier *this_local;
  handle h_local;
  
  h_local.custom_.value = h.custom_.format;
  this_local = (stringifier *)h.custom_.value;
  buf._528_8_ = this;
  h_local.custom_.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
        *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240,&local_241);
  std::allocator<char>::~allocator(&local_241);
  basic_string_view<char>::basic_string_view(&local_280);
  basic_format_parse_context<char,_fmt::v7::detail::error_handler>::basic_format_parse_context
            ((basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)local_270,
             local_280.data_,local_280.size_,0);
  buffer_appender<char>::buffer_appender(&local_2b0,(buffer<char> *)local_240);
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(&local_2c0);
  locale_ref::locale_ref(&local_2c8);
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::basic_format_context
            ((basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)local_2a8,
             local_2b0,local_2c0,local_2c8);
  basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  handle::format((handle *)&this_local,(parse_context_type *)local_270,
                 (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)local_2a8);
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)local_240,buf_00);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_240);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }